

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_setup_conn(Curl_easy *data,connectdata *conn)

{
  FILEPROTO *pFVar1;
  CURLcode result;
  HTTP *http;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pFVar1 = (FILEPROTO *)(*Curl_ccalloc)(1,0x70);
  if (pFVar1 == (FILEPROTO *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    (data->req).p.file = pFVar1;
    Curl_conncontrol(conn,0);
    if (((data->state).httpwant != '\x1f') ||
       (data_local._4_4_ = Curl_conn_may_http3(data,conn), data_local._4_4_ == CURLE_OK)) {
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http_setup_conn(struct Curl_easy *data,
                              struct connectdata *conn)
{
  /* allocate the HTTP-specific struct for the Curl_easy, only to survive
     during this request */
  struct HTTP *http;
  DEBUGASSERT(data->req.p.http == NULL);

  http = calloc(1, sizeof(struct HTTP));
  if(!http)
    return CURLE_OUT_OF_MEMORY;

  data->req.p.http = http;
  connkeep(conn, "HTTP default");

  if(data->state.httpwant == CURL_HTTP_VERSION_3ONLY) {
    CURLcode result = Curl_conn_may_http3(data, conn);
    if(result)
      return result;
  }

  return CURLE_OK;
}